

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

xmlXPathCompExprPtr xmlXPathCtxtCompile(xmlXPathContextPtr ctxt,xmlChar *str)

{
  int iVar1;
  xmlXPathParserContextPtr ctxt_00;
  xmlChar *pxVar2;
  xmlXPathContextPtr ctxt_01;
  xmlXPathCompExprPtr pxVar3;
  
  if (str != (xmlChar *)0x0) {
    xmlInitParser();
    if (ctxt == (xmlXPathContextPtr)0x0) {
      ctxt = xmlXPathNewContext((xmlDocPtr)0x0);
      ctxt_01 = ctxt;
      if (ctxt == (xmlXPathContextPtr)0x0) {
        return (xmlXPathCompExprPtr)0x0;
      }
    }
    else {
      ctxt_01 = (xmlXPathContextPtr)0x0;
    }
    ctxt_00 = xmlXPathNewParserContext(str,ctxt);
    if (ctxt_00 != (xmlXPathParserContextPtr)0x0) {
      iVar1 = ctxt->depth;
      xmlXPathCompileExpr(ctxt_00,1);
      ctxt->depth = iVar1;
      if (ctxt_00->error == 0) {
        if (*ctxt_00->cur == '\0') {
          pxVar3 = ctxt_00->comp;
          if ((1 < pxVar3->nbStep) && (-1 < (long)pxVar3->last)) {
            xmlXPathOptimizeExpression(ctxt_00,pxVar3->steps + pxVar3->last);
            ctxt->depth = iVar1;
          }
          ctxt_00->comp = (xmlXPathCompExprPtr)0x0;
        }
        else {
          xmlXPathErr(ctxt_00,7);
          pxVar3 = (xmlXPathCompExprPtr)0x0;
        }
        xmlXPathFreeParserContext(ctxt_00);
        if (ctxt_01 != (xmlXPathContextPtr)0x0) {
          xmlXPathFreeContext(ctxt_01);
        }
        if (pxVar3 == (xmlXPathCompExprPtr)0x0) {
          return (xmlXPathCompExprPtr)0x0;
        }
        pxVar2 = xmlStrdup(str);
        pxVar3->expr = pxVar2;
        return pxVar3;
      }
      xmlXPathFreeParserContext(ctxt_00);
    }
    if (ctxt_01 != (xmlXPathContextPtr)0x0) {
      xmlXPathFreeContext(ctxt_01);
    }
  }
  return (xmlXPathCompExprPtr)0x0;
}

Assistant:

xmlXPathCompExprPtr
xmlXPathCtxtCompile(xmlXPathContextPtr ctxt, const xmlChar *str) {
    xmlXPathParserContextPtr pctxt;
    xmlXPathContextPtr tmpctxt = NULL;
    xmlXPathCompExprPtr comp;
    int oldDepth = 0;

    if (str == NULL)
        return(NULL);

#ifdef XPATH_STREAMING
    comp = xmlXPathTryStreamCompile(ctxt, str);
    if (comp != NULL)
        return(comp);
#endif

    xmlInitParser();

    /*
     * We need an xmlXPathContext for the depth check.
     */
    if (ctxt == NULL) {
        tmpctxt = xmlXPathNewContext(NULL);
        if (tmpctxt == NULL)
            return(NULL);
        ctxt = tmpctxt;
    }

    pctxt = xmlXPathNewParserContext(str, ctxt);
    if (pctxt == NULL) {
        if (tmpctxt != NULL)
            xmlXPathFreeContext(tmpctxt);
        return NULL;
    }

    oldDepth = ctxt->depth;
    xmlXPathCompileExpr(pctxt, 1);
    ctxt->depth = oldDepth;

    if( pctxt->error != XPATH_EXPRESSION_OK )
    {
        xmlXPathFreeParserContext(pctxt);
        if (tmpctxt != NULL)
            xmlXPathFreeContext(tmpctxt);
        return(NULL);
    }

    if (*pctxt->cur != 0) {
	/*
	 * aleksey: in some cases this line prints *second* error message
	 * (see bug #78858) and probably this should be fixed.
	 * However, we are not sure that all error messages are printed
	 * out in other places. It's not critical so we leave it as-is for now
	 */
	xmlXPatherror(pctxt, __FILE__, __LINE__, XPATH_EXPR_ERROR);
	comp = NULL;
    } else {
	comp = pctxt->comp;
	if ((comp->nbStep > 1) && (comp->last >= 0)) {
            if (ctxt != NULL)
                oldDepth = ctxt->depth;
	    xmlXPathOptimizeExpression(pctxt, &comp->steps[comp->last]);
            if (ctxt != NULL)
                ctxt->depth = oldDepth;
	}
	pctxt->comp = NULL;
    }
    xmlXPathFreeParserContext(pctxt);
    if (tmpctxt != NULL)
        xmlXPathFreeContext(tmpctxt);

    if (comp != NULL) {
	comp->expr = xmlStrdup(str);
    }
    return(comp);
}